

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall crnlib::dynamic_string::set_char(dynamic_string *this,uint index,char c)

{
  uint uVar1;
  
  uVar1 = (uint)this->m_len;
  if (c == '\0') {
    if (index < uVar1) {
      this->m_pStr[index] = '\0';
      this->m_len = (uint16)index;
    }
  }
  else if (index < uVar1) {
    this->m_pStr[index] = c;
  }
  else if (uVar1 == index) {
    append_char(this,c);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set_char(uint index, char c)
    {
        CRNLIB_ASSERT(index <= m_len);

        if (!c)
        {
            truncate(index);
        }
        else if (index < m_len)
        {
            m_pStr[index] = c;

            check();
        }
        else if (index == m_len)
        {
            append_char(c);
        }

        return *this;
    }